

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O2

void __thiscall SemanticTypes::visit(SemanticTypes *this,FunctionNode *functionNode)

{
  TokenNode *pTVar1;
  char *pcVar2;
  StmtListNode *pSVar3;
  FunctionSymbol *pFVar4;
  
  pTVar1 = functionNode->id;
  if (pTVar1 == (TokenNode *)0x0) {
    return;
  }
  (*(pTVar1->super_ExpNode).super_StmtNode.super_ASTNode._vptr_ASTNode[3])(pTVar1,this);
  if (functionNode->id == (TokenNode *)0x0) {
    return;
  }
  pcVar2 = (functionNode->id->super_ExpNode).lexeme;
  if (pcVar2 == (char *)0x0) {
    return;
  }
  pFVar4 = FunctionTable::cSearch(functionTable,pcVar2);
  if (pFVar4 == (FunctionSymbol *)0x0) {
    return;
  }
  pcVar2 = (functionNode->id->super_ExpNode).lexeme;
  activeFunction = FunctionTable::cSearch(functionTable,pcVar2);
  beginScope(pcVar2);
  pSVar3 = functionNode->body;
  if (pSVar3 != (StmtListNode *)0x0) {
    (*(pSVar3->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pSVar3,this);
    if ((functionNode->body != (StmtListNode *)0x0) && (functionNode->body->returnAtt != false))
    goto LAB_0010ed95;
  }
  fprintf(_stderr,"[SEMANTIC ERROR - FunctionNode] RETURN EXPECTED, line: %d\n",
          (ulong)(uint)(functionNode->super_ASTNode).line);
LAB_0010ed95:
  endScope();
  return;
}

Assistant:

void SemanticTypes::visit(FunctionNode *functionNode) {

    if (functionNode->getId() != NULL) {
        functionNode->getId()->accept(this);
    }

    if (!functionNode->getId() || !functionNode->getId()->getLexeme() ||
        !functionTable->cSearch(functionNode->getId()->getLexeme()))
        return;

    const char *functionLexeme = functionNode->getId()->getLexeme();

    activeFunction = functionTable->cSearch(functionLexeme);
    beginScope(functionLexeme);

    if (functionNode->getBody() != NULL) {
        functionNode->getBody()->accept(this);
    }

    if(functionNode->getBody() == NULL || !functionNode->getBody()->isReturn())
    {
        fprintf(stderr,
                "[SEMANTIC ERROR - FunctionNode] RETURN EXPECTED, line: %d\n",
                functionNode->getLine());
    }
    endScope();
}